

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klondike.c
# Opt level: O1

void klondike_updateBoard(Board *board)

{
  GAMEID GVar1;
  Spot *pSVar2;
  int iVar3;
  int iVar4;
  
  GVar1 = (gConfig.game)->id;
  iVar3 = 0xd;
  if (1 < GVar1 - 0x17) {
    if (GVar1 == DOUBLEKLONDIKETURN1) {
      iVar3 = 9;
    }
    else {
      iVar3 = (GVar1 == DOUBLEKLONDIKETURN3) + 7 + (uint)(GVar1 == DOUBLEKLONDIKETURN3);
    }
  }
  iVar4 = 0;
  do {
    pSVar2 = board_spotGet(board,TABLEAU,(uchar)iVar4);
    if ((pSVar2->cardsCount != 0) && (pSVar2->cards[pSVar2->cardsCount - 1]->faceUp == false)) {
      pSVar2->cards[pSVar2->cardsCount - 1]->faceUp = true;
    }
    iVar4 = iVar4 + 1;
  } while (iVar3 != iVar4);
  return;
}

Assistant:

void klondike_updateBoard(Board * board)
{
	unsigned char i;
	unsigned char tableauCount = (gConfig.game->id==TRIPLEKLONDIKETURN1 || gConfig.game->id==TRIPLEKLONDIKETURN3 ? 13 : (gConfig.game->id==DOUBLEKLONDIKETURN1 || gConfig.game->id==DOUBLEKLONDIKETURN3 ? 9 : 7));
	Spot * tableau;

	for(i=0;i<tableauCount;i++)
	{
		tableau = board_spotGet(board, TABLEAU, i);

		if(tableau->cardsCount==0)
			continue;

		if(!tableau->cards[tableau->cardsCount-1]->faceUp)
			tableau->cards[tableau->cardsCount-1]->faceUp = true;
	}
}